

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcUnroll.c
# Opt level: O1

Gia_Man_t * Unr_ManUnrollFrame(Unr_Man_t *p,int f)

{
  Gia_Man_t *pGVar1;
  Vec_Int_t *p_00;
  Gia_Obj_t *pGVar2;
  ulong uVar3;
  int iVar4;
  Gia_Obj_t *pGVar5;
  int *piVar6;
  long lVar7;
  long lVar8;
  int iVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  int *piVar14;
  uint uVar15;
  uint uVar16;
  long lVar17;
  int *piVar18;
  uint uVar19;
  ulong uVar20;
  
  if (p->pGia->nRegs < p->pGia->vCis->nSize) {
    iVar9 = 0;
    do {
      pGVar1 = p->pFrames;
      p_00 = p->vPiLits;
      pGVar5 = Gia_ManAppendObj(pGVar1);
      uVar20 = *(ulong *)pGVar5;
      *(ulong *)pGVar5 = uVar20 | 0x9fffffff;
      *(ulong *)pGVar5 =
           uVar20 & 0xe0000000ffffffff | 0x9fffffff |
           (ulong)(pGVar1->vCis->nSize & 0x1fffffff) << 0x20;
      pGVar2 = pGVar1->pObjs;
      if ((pGVar5 < pGVar2) || (pGVar2 + pGVar1->nObjs <= pGVar5)) {
LAB_00583a60:
        __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/gia.h"
                      ,0x1d4,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
      }
      Vec_IntPush(pGVar1->vCis,(int)((ulong)((long)pGVar5 - (long)pGVar2) >> 2) * -0x55555555);
      pGVar2 = pGVar1->pObjs;
      if ((pGVar5 < pGVar2) || (pGVar2 + pGVar1->nObjs <= pGVar5)) goto LAB_00583a60;
      Vec_IntPush(p_00,(int)((ulong)((long)pGVar5 - (long)pGVar2) >> 2) * 0x55555556);
      iVar9 = iVar9 + 1;
    } while (iVar9 < p->pGia->vCis->nSize - p->pGia->nRegs);
  }
  iVar9 = p->vObjLim->nSize;
  uVar10 = ~f + iVar9;
  uVar12 = 0;
  if (0 < (int)uVar10) {
    uVar12 = uVar10;
  }
  if (iVar9 <= (int)uVar12) {
LAB_00583afb:
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                  ,0x1a7,"int Vec_IntEntry(Vec_Int_t *, int)");
  }
  uVar20 = (ulong)p->vObjLim->pArray[uVar12];
  piVar14 = p->pObjs;
  piVar18 = p->pEnd;
  piVar6 = piVar14 + uVar20;
  if (piVar6 < piVar18) {
    do {
      iVar9 = (int)uVar20;
      if (iVar9 < 0) {
LAB_00583a41:
        __assert_fail("h >= 0 && h < p->pEnd - p->pObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/sat/bmc/bmcUnroll.c"
                      ,0x44,"Unr_Obj_t *Unr_ManObj(Unr_Man_t *, int)");
      }
      lVar17 = (long)piVar18 - (long)piVar14 >> 2;
      if (lVar17 <= (long)(uVar20 & 0xffffffff)) goto LAB_00583a41;
      piVar6 = piVar14 + (uVar20 & 0xffffffff);
      uVar20 = *(ulong *)(piVar6 + 2);
      uVar12 = (uint)uVar20;
      if ((uVar12 & 0xfffe0000) == 0xfffe0000 || (uVar20 & 0x1fffc) == 0x1fffc) {
        uVar10 = (uint)(uVar20 >> 0x20);
        if ((int)(uVar20 & 0x1fffc) == 0x1fffc || (uVar12 & 0xfffe0000) != 0xfffe0000) {
          if (((uVar20 & 0x100000000) == 0) || (f < piVar6[1])) {
            __assert_fail("pUnrObj->fItIsPi && f >= (int)pUnrObj->hFan1",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/sat/bmc/bmcUnroll.c"
                          ,0x194,"Gia_Man_t *Unr_ManUnrollFrame(Unr_Man_t *, int)");
          }
          uVar12 = (p->pGia->vCis->nSize - p->pGia->nRegs) * (f - piVar6[1]) + *piVar6;
          if (((int)uVar12 < 0) || (p->vPiLits->nSize <= (int)uVar12)) goto LAB_00583afb;
          iVar4 = p->vPiLits->pArray[uVar12];
          if (iVar4 < 0) {
LAB_00583a9e:
            __assert_fail("Value >= 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/sat/bmc/bmcUnroll.c"
                          ,0x5f,"void Unr_ManObjSetValue(Unr_Obj_t *, int)");
          }
          uVar3 = (ulong)((uVar10 >> 0x11) + 1 & 0x7fff) % (ulong)(uVar10 >> 2 & 0x7fff);
          *(ulong *)(piVar6 + 2) = uVar20 & 0x1ffffffffffff | uVar3 << 0x31;
          piVar6[uVar3 + 5] = iVar4;
        }
        else {
          lVar7 = (long)*piVar6;
          if ((lVar7 < 0) || (lVar17 <= lVar7)) goto LAB_00583a41;
          uVar13 = (uint)((ulong)*(undefined8 *)(piVar14 + lVar7 + 2) >> 0x20);
          uVar11 = uVar13 >> 2 & 0x7fff;
          uVar13 = uVar13 >> 0x11;
          if (uVar11 <= uVar13) goto LAB_00583abd;
          uVar15 = (uint)(uVar20 >> 2) & 0x7fff;
          if (uVar11 <= uVar15) goto LAB_00583adc;
          if (piVar14[lVar7 + (long)((int)((uVar13 - uVar15) + uVar11) % (int)uVar11) + 5] < 0)
          goto LAB_00583a7f;
          uVar12 = piVar14[lVar7 + (long)((int)((uVar13 - uVar15) + uVar11) % (int)uVar11) + 5] ^
                   uVar12 & 1;
          uVar3 = (ulong)((uVar10 >> 0x11) + 1 & 0x7fff) % (ulong)(uVar10 >> 2 & 0x7fff);
          *(ulong *)(piVar6 + 2) = uVar20 & 0x1ffffffffffff | uVar3 << 0x31;
          piVar6[uVar3 + 5] = uVar12;
          if ((uVar20 >> 0x21 & 1) != 0) {
            Gia_ManAppendCo(p->pFrames,uVar12);
          }
        }
      }
      else {
        lVar7 = (long)*piVar6;
        if ((lVar7 < 0) || (lVar17 <= lVar7)) goto LAB_00583a41;
        uVar10 = (uint)((ulong)*(undefined8 *)(piVar14 + lVar7 + 2) >> 0x20);
        uVar13 = uVar10 >> 2 & 0x7fff;
        uVar10 = uVar10 >> 0x11;
        if (uVar13 <= uVar10) {
LAB_00583abd:
          __assert_fail("pFanin->RankCur < pFanin->RankMax",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/sat/bmc/bmcUnroll.c"
                        ,0x4c,"int Unr_ManFanin0Value(Unr_Man_t *, Unr_Obj_t *)");
        }
        uVar11 = (uint)(uVar20 >> 2) & 0x7fff;
        if (uVar13 <= uVar11) {
LAB_00583adc:
          __assert_fail("pObj->uRDiff0 < pFanin->RankMax",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/sat/bmc/bmcUnroll.c"
                        ,0x4d,"int Unr_ManFanin0Value(Unr_Man_t *, Unr_Obj_t *)");
        }
        if (piVar14[lVar7 + (long)((int)((uVar10 - uVar11) + uVar13) % (int)uVar13) + 5] < 0) {
LAB_00583a7f:
          __assert_fail("Lit >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/util/abc_global.h"
                        ,0x132,"int Abc_LitNotCond(int, int)");
        }
        lVar8 = (long)piVar6[1];
        if ((lVar8 < 0) || (lVar17 <= lVar8)) goto LAB_00583a41;
        uVar15 = (uint)((ulong)*(undefined8 *)(piVar14 + lVar8 + 2) >> 0x20);
        uVar16 = uVar15 >> 2 & 0x7fff;
        uVar15 = uVar15 >> 0x11;
        if (uVar16 <= uVar15) {
          __assert_fail("pFanin->RankCur < pFanin->RankMax",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/sat/bmc/bmcUnroll.c"
                        ,0x54,"int Unr_ManFanin1Value(Unr_Man_t *, Unr_Obj_t *)");
        }
        uVar19 = (uint)(uVar20 >> 0x11) & 0x7fff;
        if (uVar16 <= uVar19) {
          __assert_fail("pObj->uRDiff1 < pFanin->RankMax",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/sat/bmc/bmcUnroll.c"
                        ,0x55,"int Unr_ManFanin1Value(Unr_Man_t *, Unr_Obj_t *)");
        }
        if (piVar14[lVar8 + (long)((int)((uVar15 - uVar19) + uVar16) % (int)uVar16) + 5] < 0)
        goto LAB_00583a7f;
        iVar4 = Gia_ManHashAnd(p->pFrames,
                               piVar14[lVar7 + (long)((int)((uVar10 - uVar11) + uVar13) %
                                                     (int)uVar13) + 5] ^ uVar12 & 1,
                               piVar14[lVar8 + (long)((int)((uVar15 - uVar19) + uVar16) %
                                                     (int)uVar16) + 5] ^ uVar12 >> 1 & 1);
        if (iVar4 < 0) goto LAB_00583a9e;
        uVar12 = (uint)(*(ulong *)(piVar6 + 2) >> 0x20);
        uVar20 = (ulong)((uVar12 >> 0x11) + 1 & 0x7fff) % (ulong)(uVar12 >> 2 & 0x7fff);
        *(ulong *)(piVar6 + 2) = *(ulong *)(piVar6 + 2) & 0x1ffffffffffff | uVar20 << 0x31;
        piVar6[uVar20 + 5] = iVar4;
      }
      uVar12 = (uint)((ulong)*(undefined8 *)(piVar6 + 2) >> 0x22) & 0x7ffe;
      uVar20 = (ulong)(iVar9 + uVar12 + 6);
      piVar14 = p->pObjs;
      piVar18 = p->pEnd;
      piVar6 = piVar14 + (ulong)(iVar9 + uVar12) + 6;
    } while (piVar6 < piVar18);
  }
  if (piVar6 != piVar18) {
    __assert_fail("p->pObjs + hStart == p->pEnd",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/sat/bmc/bmcUnroll.c"
                  ,0x19a,"Gia_Man_t *Unr_ManUnrollFrame(Unr_Man_t *, int)");
  }
  pGVar1 = p->pFrames;
  if (pGVar1->vCos->nSize - pGVar1->nRegs != (p->pGia->vCos->nSize - p->pGia->nRegs) * (f + 1)) {
    __assert_fail("Gia_ManPoNum(p->pFrames) == (f + 1) * Gia_ManPoNum(p->pGia)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/sat/bmc/bmcUnroll.c"
                  ,0x19b,"Gia_Man_t *Unr_ManUnrollFrame(Unr_Man_t *, int)");
  }
  return pGVar1;
}

Assistant:

Gia_Man_t * Unr_ManUnrollFrame( Unr_Man_t * p, int f )
{
    int i, iLit, iLit0, iLit1, hStart;
    for ( i = 0; i < Gia_ManPiNum(p->pGia); i++ )
        Vec_IntPush( p->vPiLits, Gia_ManAppendCi(p->pFrames) );
    hStart = Vec_IntEntry( p->vObjLim, Abc_MaxInt(0, Vec_IntSize(p->vObjLim)-1-f) );
    while ( p->pObjs + hStart < p->pEnd )
    {
        Unr_Obj_t * pUnrObj = Unr_ManObj( p, hStart );
        if ( pUnrObj->uRDiff0 != UNR_DIFF_NULL && pUnrObj->uRDiff1 != UNR_DIFF_NULL ) // AND node
        {
            iLit0 = Unr_ManFanin0Value( p, pUnrObj );
            iLit1 = Unr_ManFanin1Value( p, pUnrObj );
            iLit  = Gia_ManHashAnd( p->pFrames, iLit0, iLit1 );
            Unr_ManObjSetValue( pUnrObj, iLit );
        }
        else if ( pUnrObj->uRDiff0 != UNR_DIFF_NULL && pUnrObj->uRDiff1 == UNR_DIFF_NULL ) // PO/RI/RO
        {
            iLit  = Unr_ManFanin0Value( p, pUnrObj );
            Unr_ManObjSetValue( pUnrObj, iLit );
            if ( pUnrObj->fItIsPo )
                Gia_ManAppendCo( p->pFrames, iLit );
        }
        else // PI  (pUnrObj->hFan0 is CioId; pUnrObj->hFan1 is tent)
        {
            assert( pUnrObj->fItIsPi && f >= (int)pUnrObj->hFan1 );
            iLit = Vec_IntEntry( p->vPiLits, Gia_ManPiNum(p->pGia) * (f - pUnrObj->hFan1) + pUnrObj->hFan0 );
            Unr_ManObjSetValue( pUnrObj, iLit );
        }
        hStart += Unr_ObjSize( pUnrObj );
    }
    assert( p->pObjs + hStart == p->pEnd );
    assert( Gia_ManPoNum(p->pFrames) == (f + 1) * Gia_ManPoNum(p->pGia) );
    return p->pFrames;
}